

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_emwin.cc
# Opt level: O1

void __thiscall EMWINHandler::handle(EMWINHandler *this,shared_ptr<const_lrit::File> *f)

{
  pointer pcVar1;
  element_type *peVar2;
  FileWriter *pFVar3;
  bool bVar4;
  string *psVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar6;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  EMWINHandler *pEVar7;
  NOAALRITHeader NVar8;
  string path;
  string text;
  timespec time;
  Zip zip;
  FilenameBuilder fb;
  PrimaryHeader ph;
  undefined1 local_400 [40];
  undefined1 local_3d8 [32];
  string local_3b8;
  string local_398;
  string local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  undefined1 local_348 [112];
  _Alloc_hider local_2d8;
  size_type local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  _Alloc_hider local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  string asStack_278 [8];
  _Alloc_hider local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  undefined8 local_258;
  pointer pbStack_250;
  AWIPS local_248;
  _Alloc_hider local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Alloc_hider local_c8;
  pointer local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Alloc_hider local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  PrimaryHeader local_48;
  
  peVar2 = (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  lrit::getHeader<lrit::PrimaryHeader>(&local_48,&peVar2->header_,&peVar2->m_);
  if (local_48.fileType == '\x02') {
    peVar2 = (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    NVar8 = lrit::getHeader<lrit::NOAALRITHeader>(&peVar2->header_,&peVar2->m_);
    if (NVar8.productID == 9) {
      peVar2 = (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pEVar7 = (EMWINHandler *)local_298;
      lrit::getHeader<lrit::AnnotationHeader>
                ((AnnotationHeader *)pEVar7,&peVar2->header_,&peVar2->m_);
      if ((undefined1 *)local_298._8_8_ == local_288 + 8) {
        local_3b8.field_2._M_local_buf[8] = (char)asStack_278[0];
        local_3b8.field_2._M_local_buf[9] = (char)asStack_278[1];
        local_3b8.field_2._M_local_buf[10] = (char)asStack_278[2];
        local_3b8.field_2._M_local_buf[0xb] = (char)asStack_278[3];
        local_3b8.field_2._M_local_buf[0xc] = (char)asStack_278[4];
        local_3b8.field_2._M_local_buf[0xd] = (char)asStack_278[5];
        local_3b8.field_2._M_local_buf[0xe] = (char)asStack_278[6];
        local_3b8.field_2._M_local_buf[0xf] = (char)asStack_278[7];
        local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
      }
      else {
        local_3b8._M_dataplus._M_p = (pointer)local_298._8_8_;
      }
      local_3b8.field_2._M_allocated_capacity = local_288._8_8_;
      local_358._M_allocated_capacity = 0;
      local_358._8_8_ = (pointer)0x0;
      bVar4 = extractTimeStamp(pEVar7,&local_3b8,(timespec *)&local_358);
      if (bVar4) {
        local_298._0_8_ = local_288;
        local_298._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_288[0] = '\0';
        asStack_278 = (string  [8])&local_268;
        local_270._M_p = (pointer)0x0;
        local_268._M_local_buf[0] = '\0';
        local_248.t1t2._M_dataplus._M_p = (pointer)&local_248.t1t2.field_2;
        local_258 = 0;
        pbStack_250 = (pointer)0x0;
        local_248.t1t2._M_string_length = 0;
        local_248.t1t2.field_2._M_local_buf[0] = '\0';
        local_248.a1a2._M_dataplus._M_p = (pointer)&local_248.a1a2.field_2;
        local_248.a1a2._M_string_length = 0;
        local_248.a1a2.field_2._M_local_buf[0] = '\0';
        local_248.ii._M_dataplus._M_p = (pointer)&local_248.ii.field_2;
        local_248.ii._M_string_length = 0;
        local_248.ii.field_2._M_local_buf[0] = '\0';
        local_248.cccc._M_dataplus._M_p = (pointer)&local_248.cccc.field_2;
        local_248.cccc._M_string_length = 0;
        local_248.cccc.field_2._M_local_buf[0] = '\0';
        local_248.yy._M_dataplus._M_p = (pointer)&local_248.yy.field_2;
        local_248.yy._M_string_length = 0;
        local_248.yy.field_2._M_local_buf[0] = '\0';
        local_248.gggg._M_dataplus._M_p = (pointer)&local_248.gggg.field_2;
        local_248.gggg._M_string_length = 0;
        local_248.gggg.field_2._M_local_buf[0] = '\0';
        local_248.bbb._M_dataplus._M_p = (pointer)&local_248.bbb.field_2;
        local_248.bbb._M_string_length = 0;
        local_248.bbb.field_2._M_local_buf[0] = _S_red;
        local_248.nnn._M_dataplus._M_p = (pointer)&local_248.nnn.field_2;
        local_248.nnn._M_string_length = 0;
        local_248.nnn.field_2._M_local_buf[0] = '\0';
        local_248.xxx._M_dataplus._M_p = (pointer)&local_248.xxx.field_2;
        local_248.xxx._M_string_length = 0;
        local_248.xxx.field_2._M_local_buf[0] = '\0';
        local_248.qq._M_dataplus._M_p = (pointer)&local_248.qq.field_2;
        local_248.qq._M_string_length = 0;
        local_248.qq.field_2._M_local_buf[0] = '\0';
        local_108._M_p = (pointer)&local_f8;
        local_100 = 0;
        local_f8._M_local_buf[0] = '\0';
        local_e8._M_p = (pointer)&local_d8;
        local_e0 = 0;
        local_d8._M_local_buf[0] = '\0';
        local_c8._M_p = (pointer)&local_b8;
        local_c0 = (pointer)0x0;
        local_b8._M_local_buf[0] = '\0';
        local_a8._M_p = (pointer)&local_98;
        local_a0 = 0;
        local_98._M_local_buf[0] = '\0';
        local_88._M_p = (pointer)&local_78;
        local_80 = 0;
        local_78._M_local_buf[0] = '\0';
        local_68._M_p = (pointer)&local_58;
        local_60 = 0;
        local_58._M_local_buf[0] = '\0';
        pEVar7 = (EMWINHandler *)local_298;
        std::__cxx11::string::_M_assign((string *)pEVar7);
        local_258 = local_358._M_allocated_capacity;
        pbStack_250 = (pointer)local_358._8_8_;
        bVar4 = extractAWIPS(pEVar7,&local_3b8,&local_248);
        if (bVar4) {
          if (NVar8.noaaSpecificCompression == '\0') {
            removeSuffix((string *)local_348,&local_3b8);
            std::__cxx11::string::operator=(asStack_278,(string *)local_348);
            if ((basic_istream<char,_std::char_traits<char>_> *)local_348._0_8_ !=
                (basic_istream<char,_std::char_traits<char>_> *)(local_348 + 0x10)) {
              operator_delete((void *)local_348._0_8_,local_348._16_8_ + 1);
            }
            local_400._0_8_ = local_400 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"{filename}","");
            local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"TXT","");
            psVar5 = &local_398;
            FilenameBuilder::build
                      ((string *)local_348,(FilenameBuilder *)local_298,(string *)local_400,psVar5);
            pvVar6 = extraout_RDX_02;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_dataplus._M_p != &local_398.field_2) {
              operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1
                             );
              pvVar6 = extraout_RDX_03;
            }
            if ((undefined1 *)local_400._0_8_ != local_400 + 0x10) {
              operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
              pvVar6 = extraout_RDX_04;
            }
            pFVar3 = (this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            lrit::File::read((File *)local_400,
                             (int)(f->
                                  super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr,pvVar6,(size_t)psVar5);
            FileWriter::write(pFVar3,(int)local_348,local_400,0);
            if ((pointer)local_400._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_400._0_8_,local_400._16_8_ - local_400._0_8_);
            }
            if ((this->config_).json == true) {
              FileWriter::writeHeader
                        ((this->fileWriter_).
                         super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,(string *)local_348);
            }
            if ((basic_istream<char,_std::char_traits<char>_> *)local_348._0_8_ !=
                (basic_istream<char,_std::char_traits<char>_> *)(local_348 + 0x10)) {
              operator_delete((void *)local_348._0_8_,local_348._16_8_ + 1);
            }
          }
          else if ((NVar8._14_2_ & 0xff) == 10) {
            lrit::File::getData((File *)(local_400 + 0x20));
            Zip::Zip((Zip *)local_348,
                     (unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                      *)(local_400 + 0x20));
            if ((long *)local_400._32_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_400._32_8_ + 8))();
            }
            local_400._32_8_ = (long *)0x0;
            pcVar1 = local_400 + 0x10;
            local_400._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_400,local_2d8._M_p,local_2d8._M_p + local_2d0);
            std::__cxx11::string::operator=(asStack_278,(string *)local_400);
            if ((pointer)local_400._0_8_ != pcVar1) {
              operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
            }
            local_3d8._0_8_ = local_3d8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"{filename}","");
            local_378._M_string_length = 0;
            local_378.field_2._M_local_buf[0] = '\0';
            psVar5 = &local_378;
            local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
            FilenameBuilder::build
                      ((string *)local_400,(FilenameBuilder *)local_298,(string *)local_3d8,psVar5);
            pvVar6 = extraout_RDX;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_dataplus._M_p != &local_378.field_2) {
              operator_delete(local_378._M_dataplus._M_p,
                              CONCAT71(local_378.field_2._M_allocated_capacity._1_7_,
                                       local_378.field_2._M_local_buf[0]) + 1);
              pvVar6 = extraout_RDX_00;
            }
            if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
              operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
              pvVar6 = extraout_RDX_01;
            }
            pFVar3 = (this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            Zip::read((Zip *)local_3d8,(int)local_348,pvVar6,(size_t)psVar5);
            FileWriter::write(pFVar3,(int)local_400,local_3d8,0);
            if ((pointer)local_3d8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ - local_3d8._0_8_);
            }
            if ((this->config_).json == true) {
              FileWriter::writeHeader
                        ((this->fileWriter_).
                         super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,(string *)local_400);
            }
            if ((pointer)local_400._0_8_ != pcVar1) {
              operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_p != &local_2a8) {
              operator_delete(local_2b8._M_p,local_2a8._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_p != &local_2c8) {
              operator_delete(local_2d8._M_p,local_2c8._M_allocated_capacity + 1);
            }
            if ((tuple<std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                 )local_348._0_8_ !=
                (_Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>)0x0) {
              (**(code **)(*(long *)local_348._0_8_ + 8))();
            }
          }
        }
        FilenameBuilder::~FilenameBuilder((FilenameBuilder *)local_298);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
        operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void EMWINHandler::handle(std::shared_ptr<const lrit::File> f) {
  auto ph = f->getHeader<lrit::PrimaryHeader>();
  if (ph.fileType != 2 ) {
    return;
  }

  // Filter EMWIN
  auto nlh = f->getHeader<lrit::NOAALRITHeader>();
  if (nlh.productID != 9) {
    return;
  }

  // Extract time stamp from filename
  auto text = f->getHeader<lrit::AnnotationHeader>().text;
  struct timespec time = {0, 0};
  if (!extractTimeStamp(text, time)) {
    return;
  }

  FilenameBuilder fb;
  fb.dir = config_.dir;
  fb.time = time;

  // Assume we can extract WMO abbreviated heading from filename
  if (!extractAWIPS(text, fb.awips)) {
    return;
  }

  // Decompress if this is a ZIP file
  if (nlh.noaaSpecificCompression == 10) {
    try {
      auto zip = Zip(f->getData());
      fb.filename = zip.fileName();

      // Use filename and extension straight from ZIP file
      const auto path = fb.build("{filename}");
      fileWriter_->write(path, zip.read());
      if (config_.json) {
        fileWriter_->writeHeader(*f, path);
      }
    } catch (const Zip::SignatureError& error) {
      std::cout << "Ignoring " << text << ": " << error.what() << std::endl;
    }
    return;
  }

  // Write with TXT extension if this is not a compressed file
  if (nlh.noaaSpecificCompression == 0) {
    fb.filename = removeSuffix(text);

    // Compressed TXT files also use the uppercase TXT extension
    const auto path = fb.build("{filename}", "TXT");
    fileWriter_->write(path, f->read());
    if (config_.json) {
      fileWriter_->writeHeader(*f, path);
    }
    return;
  }
}